

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

void __thiscall MakefileGenerator::writeExtraTargets(MakefileGenerator *this,QTextStream *t)

{
  QLatin1StringView s;
  bool bVar1;
  const_iterator cVar2;
  QLatin1String *this_00;
  qsizetype qVar3;
  QTextStream *pQVar4;
  QMakeProject *in_RSI;
  QStringBuilder<const_char_(&)[2],_QString> *in_RDI;
  long in_FS_OFFSET;
  ProStringList *config;
  ProStringList *deplist;
  ProStringList *qut;
  QString dep;
  ConstIterator dep_it;
  QString deps;
  QFlagsStorage<MakefileGenerator::FileFixifyType> in_stack_0000024c;
  QString cmd;
  QString targ;
  ConstIterator it;
  undefined4 in_stack_fffffffffffffce8;
  FileFixifyType in_stack_fffffffffffffcec;
  QMakeProject *in_stack_fffffffffffffcf0;
  char (*in_stack_fffffffffffffcf8) [2];
  char *pcVar5;
  QString *a;
  undefined1 local_298 [47];
  undefined1 in_stack_fffffffffffffd97;
  QString *in_stack_fffffffffffffd98;
  MakefileGenerator *in_stack_fffffffffffffda0;
  undefined1 local_210 [80];
  QStringBuilder<const_ProString_&,_const_char_(&)[8]> local_1c0;
  undefined1 local_1b0 [48];
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  const_iterator local_168;
  QStringBuilder<const_ProString_&,_const_char_(&)[9]> local_160;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  QStringBuilder<const_ProString_&,_const_char_(&)[10]> local_f0;
  undefined1 local_e0 [48];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  QStringBuilder<const_ProString_&,_const_char_(&)[8]> local_98;
  undefined1 local_88 [48];
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  const_iterator local_40 [7];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  a = (QString *)in_RDI[6].b.d.size;
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffcf0,
                 (char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  QMakeProject::values
            (in_stack_fffffffffffffcf0,
             (ProKey *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  ProKey::~ProKey((ProKey *)0x1900f3);
  local_40[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
  local_40[0] = QList<ProString>::begin((QList<ProString> *)in_stack_fffffffffffffcf0);
  while( true ) {
    cVar2 = QList<ProString>::end((QList<ProString> *)in_stack_fffffffffffffcf0);
    bVar1 = QList<ProString>::const_iterator::operator!=(local_40,cVar2);
    if (!bVar1) break;
    local_58 = 0xaaaaaaaaaaaaaaaa;
    local_50 = 0xaaaaaaaaaaaaaaaa;
    local_48 = 0xaaaaaaaaaaaaaaaa;
    QList<ProString>::const_iterator::operator*(local_40);
    local_98 = ::operator+((ProString *)in_stack_fffffffffffffcf0,
                           (char (*) [8])
                           CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    ProKey::ProKey<ProString_const&,char_const(&)[8]>
              ((ProKey *)in_stack_fffffffffffffcf0,
               (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)
               CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    (**(code **)(in_RDI->a + 0x58))(&local_58,in_RDI,local_88);
    ProKey::~ProKey((ProKey *)0x1901e1);
    local_b0 = 0xaaaaaaaaaaaaaaaa;
    local_a8 = 0xaaaaaaaaaaaaaaaa;
    local_a0 = 0xaaaaaaaaaaaaaaaa;
    QList<ProString>::const_iterator::operator*(local_40);
    local_f0 = ::operator+((ProString *)in_stack_fffffffffffffcf0,
                           (char (*) [10])
                           CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    ProKey::ProKey<ProString_const&,char_const(&)[10]>
              ((ProKey *)in_stack_fffffffffffffcf0,
               (QStringBuilder<const_ProString_&,_const_char_(&)[10]> *)
               CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    (**(code **)(in_RDI->a + 0x58))(&local_b0,in_RDI,local_e0);
    ProKey::~ProKey((ProKey *)0x19027a);
    local_108 = 0xaaaaaaaaaaaaaaaa;
    local_100 = 0xaaaaaaaaaaaaaaaa;
    local_f8 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x1902b4);
    bVar1 = QString::isEmpty((QString *)0x1902c1);
    if (bVar1) {
      QList<ProString>::const_iterator::operator*(local_40);
      ProString::toQString
                ((ProString *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      QString::operator=((QString *)in_stack_fffffffffffffcf0,
                         (QString *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      QString::~QString((QString *)0x190306);
    }
    pcVar5 = (char *)in_RDI[6].b.d.size;
    QList<ProString>::const_iterator::operator*(local_40);
    local_160 = ::operator+((ProString *)in_stack_fffffffffffffcf0,
                            (char (*) [9])
                            CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    ProKey::ProKey<ProString_const&,char_const(&)[9]>
              ((ProKey *)in_stack_fffffffffffffcf0,
               (QStringBuilder<const_ProString_&,_const_char_(&)[9]> *)
               CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    QMakeProject::values
              (in_stack_fffffffffffffcf0,
               (ProKey *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    ProKey::~ProKey((ProKey *)0x19038b);
    local_168.i = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_168 = QList<ProString>::begin((QList<ProString> *)in_stack_fffffffffffffcf0);
    while( true ) {
      cVar2 = QList<ProString>::end((QList<ProString> *)in_stack_fffffffffffffcf0);
      bVar1 = QList<ProString>::const_iterator::operator!=(&local_168,cVar2);
      if (!bVar1) break;
      local_180 = 0xaaaaaaaaaaaaaaaa;
      local_178 = 0xaaaaaaaaaaaaaaaa;
      local_170 = 0xaaaaaaaaaaaaaaaa;
      QList<ProString>::const_iterator::operator*(&local_168);
      local_1c0 = ::operator+((ProString *)in_stack_fffffffffffffcf0,
                              (char (*) [8])
                              CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      ProKey::ProKey<ProString_const&,char_const(&)[8]>
                ((ProKey *)in_stack_fffffffffffffcf0,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)
                 CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      (**(code **)(in_RDI->a + 0x58))(&local_180,in_RDI,local_1b0);
      ProKey::~ProKey((ProKey *)0x190479);
      bVar1 = QString::isEmpty((QString *)0x190486);
      if (bVar1) {
        QList<ProString>::const_iterator::operator*(&local_168);
        ProString::toQString
                  ((ProString *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        QString::operator=((QString *)in_stack_fffffffffffffcf0,
                           (QString *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8))
        ;
        QString::~QString((QString *)0x1904cb);
      }
      (**(code **)(in_RDI->a + 0x34))(local_210,in_RDI,&local_180);
      ::operator+(in_stack_fffffffffffffcf8,(QString *)in_stack_fffffffffffffcf0);
      ::operator+=(a,in_RDI);
      QStringBuilder<const_char_(&)[2],_QString>::~QStringBuilder
                ((QStringBuilder<const_char_(&)[2],_QString> *)0x190524);
      QString::~QString((QString *)0x190531);
      QString::~QString((QString *)0x19053e);
      QList<ProString>::const_iterator::operator++(&local_168);
    }
    in_stack_fffffffffffffcf8 = (char (*) [2])in_RDI[6].b.d.size;
    QList<ProString>::const_iterator::operator*(local_40);
    ::operator+((ProString *)in_stack_fffffffffffffcf0,
                (char (*) [8])CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    ProKey::ProKey<ProString_const&,char_const(&)[8]>
              ((ProKey *)in_stack_fffffffffffffcf0,
               (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)
               CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    this_00 = (QLatin1String *)
              QMakeProject::values
                        (in_stack_fffffffffffffcf0,
                         (ProKey *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    ProKey::~ProKey((ProKey *)0x1905d5);
    qVar3 = QListSpecialMethodsBase<ProString>::indexOf<char[11]>
                      ((QListSpecialMethodsBase<ProString> *)in_stack_fffffffffffffcf0,
                       (char (*) [11])CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                       0x1905f4);
    if (qVar3 != -1) {
      QFlags<MakefileGenerator::FileFixifyType>::QFlags
                ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_fffffffffffffcf0,
                 in_stack_fffffffffffffcec);
      fileFixify(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                 (FileFixifyTypes)in_stack_0000024c.i,(bool)in_stack_fffffffffffffd97);
      QString::operator=((QString *)in_stack_fffffffffffffcf0,
                         (QString *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      QString::~QString((QString *)0x190655);
    }
    qVar3 = QListSpecialMethodsBase<ProString>::indexOf<char[6]>
                      ((QListSpecialMethodsBase<ProString> *)in_stack_fffffffffffffcf0,
                       (char (*) [6])CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                       0x19066a);
    if (qVar3 != -1) {
      QLatin1String::QLatin1String(this_00,*in_stack_fffffffffffffcf8);
      s.m_data = pcVar5;
      s.m_size = (qsizetype)this_00;
      QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),s
                         );
    }
    in_stack_fffffffffffffcf0 = in_RSI;
    (**(code **)(in_RDI->a + 0x34))(local_298,in_RDI,&local_58);
    pQVar4 = (QTextStream *)
             QTextStream::operator<<((QTextStream *)in_stack_fffffffffffffcf0,(QString *)local_298);
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,":");
    QTextStream::operator<<(pQVar4,(QString *)&local_108);
    QString::~QString((QString *)0x190704);
    bVar1 = QString::isEmpty((QString *)0x190711);
    if (!bVar1) {
      pQVar4 = (QTextStream *)QTextStream::operator<<((QTextStream *)in_RSI,"\n\t");
      QTextStream::operator<<(pQVar4,(QString *)&local_b0);
    }
    ::operator<<((QTextStream *)in_stack_fffffffffffffcf0,
                 (QTextStreamFunction)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8))
    ;
    ::operator<<((QTextStream *)in_stack_fffffffffffffcf0,
                 (QTextStreamFunction)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8))
    ;
    QString::~QString((QString *)0x190763);
    QString::~QString((QString *)0x190770);
    QString::~QString((QString *)0x19077d);
    QList<ProString>::const_iterator::operator++(local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void
MakefileGenerator::writeExtraTargets(QTextStream &t)
{
    const ProStringList &qut = project->values("QMAKE_EXTRA_TARGETS");
    for (ProStringList::ConstIterator it = qut.begin(); it != qut.end(); ++it) {
        QString targ = var(ProKey(*it + ".target")),
                 cmd = var(ProKey(*it + ".commands")), deps;
        if(targ.isEmpty())
            targ = (*it).toQString();
        const ProStringList &deplist = project->values(ProKey(*it + ".depends"));
        for (ProStringList::ConstIterator dep_it = deplist.begin(); dep_it != deplist.end(); ++dep_it) {
            QString dep = var(ProKey(*dep_it + ".target"));
            if(dep.isEmpty())
                dep = (*dep_it).toQString();
            deps += " " + escapeDependencyPath(dep);
        }
        const ProStringList &config = project->values(ProKey(*it + ".CONFIG"));
        if (config.indexOf("fix_target") != -1)
            targ = fileFixify(targ, FileFixifyFromOutdir);
        if (config.indexOf("phony") != -1)
            deps += QLatin1String(" FORCE");
        t << escapeDependencyPath(targ) << ":" << deps;
        if(!cmd.isEmpty())
            t << "\n\t" << cmd;
        t << Qt::endl << Qt::endl;
    }
}